

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Method
          (string *__return_storage_ptr__,Namer *this,string *pre,string *mid,string *suf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *suf_local;
  string *mid_local;
  string *pre_local;
  Namer *this_local;
  
  local_30 = suf;
  suf_local = mid;
  mid_local = pre;
  pre_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  std::operator+(&local_b0,pre,"_");
  std::operator+(&local_90,&local_b0,suf_local);
  std::operator+(&local_70,&local_90,"_");
  std::operator+(&local_50,&local_70,local_30);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_50,(ulong)(this->config_).methods);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Method(const std::string &pre,
                             const std::string &mid,
                             const std::string &suf) const {
    return Format(pre + "_" +  mid + "_" + suf, config_.methods);
  }